

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
spirv_cross::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
operator=(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *this,SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                *other)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).buffer_size);
    uVar5 = (other->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer_size;
    if (uVar5 != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        pbVar2 = (this->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        pbVar3 = (other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        plVar1 = (long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar7);
        *plVar1 = (long)(plVar1 + 2);
        lVar4 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar7);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar7),lVar4,
                   *(long *)((long)&pbVar3->_M_string_length + lVar7) + lVar4);
        uVar6 = uVar6 + 1;
        uVar5 = (other->
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).buffer_size;
        lVar7 = lVar7 + 0x20;
      } while (uVar6 < uVar5);
    }
    (this->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = uVar5;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}